

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void * nn_allocmsg(size_t size,int type)

{
  int iVar1;
  int *piVar2;
  undefined4 in_ESI;
  undefined8 in_RDI;
  void *result;
  int rc;
  undefined8 local_20;
  undefined4 in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff8;
  
  iVar1 = nn_chunk_alloc(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20),
                         (void **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
    local_20 = (void *)0x0;
  }
  return local_20;
}

Assistant:

void *nn_allocmsg (size_t size, int type)
{
    int rc;
    void *result;

    rc = nn_chunk_alloc (size, type, &result);
    if (rc == 0)
        return result;
    errno = -rc;
    return NULL;
}